

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.h
# Opt level: O2

Index __thiscall wasm::analysis::CFGBlockIndexes::get(CFGBlockIndexes *this,Expression *expr)

{
  Index IVar1;
  const_iterator cVar2;
  Expression *local_10;
  Expression *expr_local;
  
  local_10 = expr;
  cVar2 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_10);
  if (cVar2.super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>.
      _M_cur == (__node_type *)0x0) {
    IVar1 = 0xffffffff;
  }
  else {
    IVar1 = *(Index *)((long)cVar2.
                             super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>
                             ._M_cur + 0x10);
  }
  return IVar1;
}

Assistant:

Index get(Expression* expr) const {
    auto iter = map.find(expr);
    if (iter == map.end()) {
      // There is no entry for this, which can be the case for control flow
      // structures, or for unreachable code.
      return InvalidBlock;
    }
    return iter->second;
  }